

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.cpp
# Opt level: O2

void __thiscall LoROMAddress::fromImageAddress(LoROMAddress *this,ImageAddress *imageAdress)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = imageAdress->t;
  if (uVar1 < 0x400000) {
    uVar2 = uVar1 * 2 & 0x7f0000;
    uVar3 = uVar2 + 0x800000;
    if (uVar1 < 0x3e0000) {
      uVar3 = uVar2;
    }
    (this->super_ROMAddress).m_Address = uVar1 & 0xffff | uVar3 | 0x8000;
    return;
  }
  __assert_fail("imageAdress < 0x400000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/ROMAddress.cpp"
                ,0x6e,"virtual void LoROMAddress::fromImageAddress(ImageAddress)");
}

Assistant:

void LoROMAddress::fromImageAddress(ImageAddress imageAdress) {
    assert(imageAdress < 0x400000);

    uint8_t bank = imageAdress / 0x8000;
    uint16_t bankAddress = 0x8000 + (imageAdress & 0x7FFF);
    if(imageAdress > 0x3DFFFF) {
        //we have to use the second mirror because otherwise we would refer to system RAM
        bank += 0x80;
    }
    m_Address = (bank << 16) | bankAddress;
}